

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

Test * PathEscapingSensiblePathsAreNotNeedlesslyEscaped::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x10);
  PathEscapingSensiblePathsAreNotNeedlesslyEscaped
            ((PathEscapingSensiblePathsAreNotNeedlesslyEscaped *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST(PathEscaping, SensiblePathsAreNotNeedlesslyEscaped) {
  const char* path = "some/sensible/path/without/crazy/characters.c++";
  string result;

  GetWin32EscapedString(path, &result);
  EXPECT_EQ(path, result);
  result.clear();

  GetShellEscapedString(path, &result);
  EXPECT_EQ(path, result);
}